

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O0

ggml_tensor *
ggml_map_custom3_impl
          (ggml_context *ctx,ggml_tensor *a,ggml_tensor *b,ggml_tensor *c,ggml_custom3_op_t fun,
          int n_tasks,void *userdata,_Bool inplace)

{
  ggml_tensor *params_00;
  ggml_tensor *in_RCX;
  ggml_tensor *in_RDX;
  ggml_tensor *in_RSI;
  ggml_tensor *in_R8;
  int in_R9D;
  ggml_map_custom3_op_params params;
  ggml_tensor *result;
  ggml_tensor *in_stack_ffffffffffffffa8;
  ggml_context *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  ggml_context *in_stack_ffffffffffffffc0;
  
  if ((in_R9D != -1) && (in_R9D < 1)) {
    ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/ggml.c"
               ,0x1380,"GGML_ASSERT(%s) failed","n_tasks == GGML_N_TASKS_MAX || n_tasks > 0");
  }
  if (((byte)params.n_tasks & 1) == 0) {
    params_00 = ggml_dup_tensor(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
  }
  else {
    params_00 = ggml_view_tensor(in_stack_ffffffffffffffc0,
                                 (ggml_tensor *)
                                 CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  }
  ggml_set_op_params(in_R8,params_00,0x153d78);
  params_00->op = GGML_OP_MAP_CUSTOM3;
  params_00->src[0] = in_RSI;
  params_00->src[1] = in_RDX;
  params_00->src[2] = in_RCX;
  return params_00;
}

Assistant:

static struct ggml_tensor * ggml_map_custom3_impl(
        struct ggml_context      * ctx,
        struct ggml_tensor       * a,
        struct ggml_tensor       * b,
        struct ggml_tensor       * c,
        const  ggml_custom3_op_t   fun,
        int                        n_tasks,
        void                     * userdata,
        bool                       inplace) {
    GGML_ASSERT(n_tasks == GGML_N_TASKS_MAX || n_tasks > 0);

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    struct ggml_map_custom3_op_params params = {
        /*.fun      =*/ fun,
        /*.n_tasks  =*/ n_tasks,
        /*.userdata =*/ userdata
    };
    ggml_set_op_params(result, &params, sizeof(params));

    result->op     = GGML_OP_MAP_CUSTOM3;
    result->src[0] = a;
    result->src[1] = b;
    result->src[2] = c;

    return result;
}